

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_sha256_transform(uint32_t *s,uint32_t *chunk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint32_t t2_63;
  uint32_t t1_63;
  uint32_t t2_62;
  uint32_t t1_62;
  uint32_t t2_61;
  uint32_t t1_61;
  uint32_t t2_60;
  uint32_t t1_60;
  uint32_t t2_59;
  uint32_t t1_59;
  uint32_t t2_58;
  uint32_t t1_58;
  uint32_t t2_57;
  uint32_t t1_57;
  uint32_t t2_56;
  uint32_t t1_56;
  uint32_t t2_55;
  uint32_t t1_55;
  uint32_t t2_54;
  uint32_t t1_54;
  uint32_t t2_53;
  uint32_t t1_53;
  uint32_t t2_52;
  uint32_t t1_52;
  uint32_t t2_51;
  uint32_t t1_51;
  uint32_t t2_50;
  uint32_t t1_50;
  uint32_t t2_49;
  uint32_t t1_49;
  uint32_t t2_48;
  uint32_t t1_48;
  uint32_t t2_47;
  uint32_t t1_47;
  uint32_t t2_46;
  uint32_t t1_46;
  uint32_t t2_45;
  uint32_t t1_45;
  uint32_t t2_44;
  uint32_t t1_44;
  uint32_t t2_43;
  uint32_t t1_43;
  uint32_t t2_42;
  uint32_t t1_42;
  uint32_t t2_41;
  uint32_t t1_41;
  uint32_t t2_40;
  uint32_t t1_40;
  uint32_t t2_39;
  uint32_t t1_39;
  uint32_t t2_38;
  uint32_t t1_38;
  uint32_t t2_37;
  uint32_t t1_37;
  uint32_t t2_36;
  uint32_t t1_36;
  uint32_t t2_35;
  uint32_t t1_35;
  uint32_t t2_34;
  uint32_t t1_34;
  uint32_t t2_33;
  uint32_t t1_33;
  uint32_t t2_32;
  uint32_t t1_32;
  uint32_t t2_31;
  uint32_t t1_31;
  uint32_t t2_30;
  uint32_t t1_30;
  uint32_t t2_29;
  uint32_t t1_29;
  uint32_t t2_28;
  uint32_t t1_28;
  uint32_t t2_27;
  uint32_t t1_27;
  uint32_t t2_26;
  uint32_t t1_26;
  uint32_t t2_25;
  uint32_t t1_25;
  uint32_t t2_24;
  uint32_t t1_24;
  uint32_t t2_23;
  uint32_t t1_23;
  uint32_t t2_22;
  uint32_t t1_22;
  uint32_t t2_21;
  uint32_t t1_21;
  uint32_t t2_20;
  uint32_t t1_20;
  uint32_t t2_19;
  uint32_t t1_19;
  uint32_t t2_18;
  uint32_t t1_18;
  uint32_t t2_17;
  uint32_t t1_17;
  uint32_t t2_16;
  uint32_t t1_16;
  uint32_t t2_15;
  uint32_t t1_15;
  uint32_t t2_14;
  uint32_t t1_14;
  uint32_t t2_13;
  uint32_t t1_13;
  uint32_t t2_12;
  uint32_t t1_12;
  uint32_t t2_11;
  uint32_t t1_11;
  uint32_t t2_10;
  uint32_t t1_10;
  uint32_t t2_9;
  uint32_t t1_9;
  uint32_t t2_8;
  uint32_t t1_8;
  uint32_t t2_7;
  uint32_t t1_7;
  uint32_t t2_6;
  uint32_t t1_6;
  uint32_t t2_5;
  uint32_t t1_5;
  uint32_t t2_4;
  uint32_t t1_4;
  uint32_t t2_3;
  uint32_t t1_3;
  uint32_t t2_2;
  uint32_t t1_2;
  uint32_t t2_1;
  uint32_t t1_1;
  uint32_t t2;
  uint32_t t1;
  uint32_t w15;
  uint32_t w14;
  uint32_t w13;
  uint32_t w12;
  uint32_t w11;
  uint32_t w10;
  uint32_t w9;
  uint32_t w8;
  uint32_t w7;
  uint32_t w6;
  uint32_t w5;
  uint32_t w4;
  uint32_t w3;
  uint32_t w2;
  uint32_t w1;
  uint32_t w0;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t *chunk_local;
  uint32_t *s_local;
  
  uVar8 = *s;
  uVar6 = s[1];
  uVar9 = s[4];
  uVar7 = s[5];
  uVar4 = s[6];
  uVar10 = *chunk << 0x18 | (*chunk & 0xff00) << 8 | (*chunk & 0xff0000) >> 8 | *chunk >> 0x18;
  iVar1 = s[7] + ((uVar9 >> 6 | uVar9 << 0x1a) ^ (uVar9 >> 0xb | uVar9 << 0x15) ^
                 (uVar9 >> 0x19 | uVar9 << 7)) + (uVar4 ^ uVar9 & (uVar7 ^ uVar4)) + 0x428a2f98 +
          uVar10;
  uVar2 = iVar1 + s[3];
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 << 0x1e) ^ (uVar8 >> 0xd | uVar8 << 0x13) ^
                  (uVar8 >> 0x16 | uVar8 << 10)) + (uVar8 & uVar6 | s[2] & (uVar8 | uVar6));
  uVar11 = chunk[1] << 0x18 | (chunk[1] & 0xff00) << 8;
  uVar12 = uVar11 | (chunk[1] & 0xff0000) >> 8 | chunk[1] >> 0x18;
  iVar1 = uVar4 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + 0x71374491 +
          uVar12;
  uVar4 = iVar1 + s[2];
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar13 = chunk[2] << 0x18 | (chunk[2] & 0xff00) << 8;
  uVar14 = uVar13 | (chunk[2] & 0xff0000) >> 8 | chunk[2] >> 0x18;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + -0x4a3f0431
          + uVar14;
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                  (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar15 = chunk[3] << 0x18 | (chunk[3] & 0xff00) << 8;
  uVar16 = uVar15 | (chunk[3] & 0xff0000) >> 8 | chunk[3] >> 0x18;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + -0x164a245b
          + uVar16;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5));
  uVar17 = chunk[4] << 0x18 | (chunk[4] & 0xff00) << 8;
  uVar18 = uVar17 | (chunk[4] & 0xff0000) >> 8 | chunk[4] >> 0x18;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + 0x3956c25b +
          uVar18;
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 | uVar5 & (uVar9 | uVar7));
  uVar19 = chunk[5] << 0x18 | (chunk[5] & 0xff00) << 8;
  uVar20 = uVar19 | (chunk[5] & 0xff0000) >> 8 | chunk[5] >> 0x18;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + 0x59f111f1 +
          uVar20;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                  (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 | uVar7 & (uVar2 | uVar9));
  uVar21 = chunk[6] << 0x18 | (chunk[6] & 0xff00) << 8;
  uVar22 = uVar21 | (chunk[6] & 0xff0000) >> 8 | chunk[6] >> 0x18;
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + -0x6dc07d5c
          + uVar22;
  uVar7 = iVar1 + uVar7;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar9 & (uVar4 | uVar2));
  uVar23 = chunk[7] << 0x18 | (chunk[7] & 0xff00) << 8;
  uVar24 = uVar23 | (chunk[7] & 0xff0000) >> 8 | chunk[7] >> 0x18;
  iVar1 = uVar8 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + -0x54e3a12b
          + uVar24;
  uVar9 = iVar1 + uVar9;
  uVar8 = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4));
  uVar25 = chunk[8] << 0x18 | (chunk[8] & 0xff00) << 8;
  uVar26 = uVar25 | (chunk[8] & 0xff0000) >> 8 | chunk[8] >> 0x18;
  iVar1 = uVar3 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                  (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + -0x27f85568
          + uVar26;
  uVar2 = iVar1 + uVar2;
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                  (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
  uVar27 = chunk[9] << 0x18 | (chunk[9] & 0xff00) << 8;
  uVar28 = uVar27 | (chunk[9] & 0xff0000) >> 8 | chunk[9] >> 0x18;
  iVar1 = uVar5 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + 0x12835b01 +
          uVar28;
  uVar4 = iVar1 + uVar4;
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar29 = chunk[10] << 0x18 | (chunk[10] & 0xff00) << 8;
  uVar30 = uVar29 | (chunk[10] & 0xff0000) >> 8 | chunk[10] >> 0x18;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + 0x243185be +
          uVar30;
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                  (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar31 = chunk[0xb] << 0x18 | (chunk[0xb] & 0xff00) << 8;
  uVar32 = uVar31 | (chunk[0xb] & 0xff0000) >> 8 | chunk[0xb] >> 0x18;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + 0x550c7dc3 +
          uVar32;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5));
  uVar33 = chunk[0xc] << 0x18 | (chunk[0xc] & 0xff00) << 8;
  uVar34 = uVar33 | (chunk[0xc] & 0xff0000) >> 8 | chunk[0xc] >> 0x18;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + 0x72be5d74 +
          uVar34;
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 | uVar5 & (uVar9 | uVar7));
  uVar35 = chunk[0xd] << 0x18 | (chunk[0xd] & 0xff00) << 8;
  uVar36 = uVar35 | (chunk[0xd] & 0xff0000) >> 8 | chunk[0xd] >> 0x18;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + -0x7f214e02
          + uVar36;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                  (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 | uVar7 & (uVar2 | uVar9));
  uVar37 = chunk[0xe] << 0x18 | (chunk[0xe] & 0xff00) << 8;
  uVar38 = uVar37 | (chunk[0xe] & 0xff0000) >> 8;
  uVar39 = uVar38 | chunk[0xe] >> 0x18;
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + -0x6423f959
          + uVar39;
  uVar7 = iVar1 + uVar7;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar9 & (uVar4 | uVar2));
  uVar40 = chunk[0xf] << 0x18 | (chunk[0xf] & 0xff00) << 8;
  uVar41 = uVar40 | (chunk[0xf] & 0xff0000) >> 8;
  uVar42 = uVar41 | chunk[0xf] >> 0x18;
  iVar1 = uVar8 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + -0x3e640e8c
          + uVar42;
  uVar9 = iVar1 + uVar9;
  uVar8 = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4));
  uVar10 = ((uVar37 >> 0x11 | uVar39 << 0xf) ^ (uVar37 >> 0x13 | uVar39 << 0xd) ^ uVar38 >> 10) +
           uVar28 + ((uVar12 >> 7 | (chunk[1] >> 0x18) << 0x19) ^ (uVar11 >> 0x12 | uVar12 << 0xe) ^
                    uVar12 >> 3) + uVar10;
  iVar1 = uVar3 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                  (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + -0x1b64963f
          + uVar10;
  uVar2 = iVar1 + uVar2;
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                  (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
  uVar12 = ((uVar40 >> 0x11 | uVar42 << 0xf) ^ (uVar40 >> 0x13 | uVar42 << 0xd) ^ uVar41 >> 10) +
           uVar30 + ((uVar14 >> 7 | (chunk[2] >> 0x18) << 0x19) ^ (uVar13 >> 0x12 | uVar14 << 0xe) ^
                    uVar14 >> 3) + uVar12;
  iVar1 = uVar5 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + -0x1041b87a
          + uVar12;
  uVar4 = iVar1 + uVar4;
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar14 = ((uVar10 >> 0x11 | uVar10 * 0x8000) ^ (uVar10 >> 0x13 | uVar10 * 0x2000) ^ uVar10 >> 10)
           + uVar32 +
           ((uVar16 >> 7 | (chunk[3] >> 0x18) << 0x19) ^ (uVar15 >> 0x12 | uVar16 << 0xe) ^
           uVar16 >> 3) + uVar14;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + 0xfc19dc6 +
          uVar14;
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                  (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar16 = ((uVar12 >> 0x11 | uVar12 * 0x8000) ^ (uVar12 >> 0x13 | uVar12 * 0x2000) ^ uVar12 >> 10)
           + uVar34 +
           ((uVar18 >> 7 | (chunk[4] >> 0x18) << 0x19) ^ (uVar17 >> 0x12 | uVar18 << 0xe) ^
           uVar18 >> 3) + uVar16;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + 0x240ca1cc +
          uVar16;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5));
  uVar18 = ((uVar14 >> 0x11 | uVar14 * 0x8000) ^ (uVar14 >> 0x13 | uVar14 * 0x2000) ^ uVar14 >> 10)
           + uVar36 +
           ((uVar20 >> 7 | (chunk[5] >> 0x18) << 0x19) ^ (uVar19 >> 0x12 | uVar20 << 0xe) ^
           uVar20 >> 3) + uVar18;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + 0x2de92c6f +
          uVar18;
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 | uVar5 & (uVar9 | uVar7));
  uVar20 = ((uVar16 >> 0x11 | uVar16 * 0x8000) ^ (uVar16 >> 0x13 | uVar16 * 0x2000) ^ uVar16 >> 10)
           + uVar39 +
           ((uVar22 >> 7 | (chunk[6] >> 0x18) << 0x19) ^ (uVar21 >> 0x12 | uVar22 << 0xe) ^
           uVar22 >> 3) + uVar20;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + 0x4a7484aa +
          uVar20;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                  (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 | uVar7 & (uVar2 | uVar9));
  uVar22 = ((uVar18 >> 0x11 | uVar18 * 0x8000) ^ (uVar18 >> 0x13 | uVar18 * 0x2000) ^ uVar18 >> 10)
           + uVar42 +
           ((uVar24 >> 7 | (chunk[7] >> 0x18) << 0x19) ^ (uVar23 >> 0x12 | uVar24 << 0xe) ^
           uVar24 >> 3) + uVar22;
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + 0x5cb0a9dc +
          uVar22;
  uVar7 = iVar1 + uVar7;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar9 & (uVar4 | uVar2));
  uVar24 = ((uVar20 >> 0x11 | uVar20 * 0x8000) ^ (uVar20 >> 0x13 | uVar20 * 0x2000) ^ uVar20 >> 10)
           + uVar10 +
           ((uVar26 >> 7 | (chunk[8] >> 0x18) << 0x19) ^ (uVar25 >> 0x12 | uVar26 << 0xe) ^
           uVar26 >> 3) + uVar24;
  iVar1 = uVar8 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + 0x76f988da +
          uVar24;
  uVar9 = iVar1 + uVar9;
  uVar8 = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4));
  uVar26 = ((uVar22 >> 0x11 | uVar22 * 0x8000) ^ (uVar22 >> 0x13 | uVar22 * 0x2000) ^ uVar22 >> 10)
           + uVar12 +
           ((uVar28 >> 7 | (chunk[9] >> 0x18) << 0x19) ^ (uVar27 >> 0x12 | uVar28 << 0xe) ^
           uVar28 >> 3) + uVar26;
  iVar1 = uVar3 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                  (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + -0x67c1aeae
          + uVar26;
  uVar2 = iVar1 + uVar2;
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                  (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
  uVar28 = ((uVar24 >> 0x11 | uVar24 * 0x8000) ^ (uVar24 >> 0x13 | uVar24 * 0x2000) ^ uVar24 >> 10)
           + uVar14 +
           ((uVar30 >> 7 | (chunk[10] >> 0x18) << 0x19) ^ (uVar29 >> 0x12 | uVar30 << 0xe) ^
           uVar30 >> 3) + uVar28;
  iVar1 = uVar5 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + -0x57ce3993
          + uVar28;
  uVar4 = iVar1 + uVar4;
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar30 = ((uVar26 >> 0x11 | uVar26 * 0x8000) ^ (uVar26 >> 0x13 | uVar26 * 0x2000) ^ uVar26 >> 10)
           + uVar16 +
           ((uVar32 >> 7 | (chunk[0xb] >> 0x18) << 0x19) ^ (uVar31 >> 0x12 | uVar32 << 0xe) ^
           uVar32 >> 3) + uVar30;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + -0x4ffcd838
          + uVar30;
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                  (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar32 = ((uVar28 >> 0x11 | uVar28 * 0x8000) ^ (uVar28 >> 0x13 | uVar28 * 0x2000) ^ uVar28 >> 10)
           + uVar18 +
           ((uVar34 >> 7 | (chunk[0xc] >> 0x18) << 0x19) ^ (uVar33 >> 0x12 | uVar34 << 0xe) ^
           uVar34 >> 3) + uVar32;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + -0x40a68039
          + uVar32;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5));
  uVar34 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
           + uVar20 +
           ((uVar36 >> 7 | (chunk[0xd] >> 0x18) << 0x19) ^ (uVar35 >> 0x12 | uVar36 << 0xe) ^
           uVar36 >> 3) + uVar34;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + -0x391ff40d
          + uVar34;
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 | uVar5 & (uVar9 | uVar7));
  uVar36 = ((uVar32 >> 0x11 | uVar32 * 0x8000) ^ (uVar32 >> 0x13 | uVar32 * 0x2000) ^ uVar32 >> 10)
           + uVar22 +
           ((uVar39 >> 7 | (chunk[0xe] >> 0x18) << 0x19) ^ (uVar37 >> 0x12 | uVar39 << 0xe) ^
           uVar39 >> 3) + uVar36;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + -0x2a586eb9
          + uVar36;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                  (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 | uVar7 & (uVar2 | uVar9));
  uVar39 = ((uVar34 >> 0x11 | uVar34 * 0x8000) ^ (uVar34 >> 0x13 | uVar34 * 0x2000) ^ uVar34 >> 10)
           + uVar24 +
           ((uVar42 >> 7 | (chunk[0xf] >> 0x18) << 0x19) ^ (uVar40 >> 0x12 | uVar42 << 0xe) ^
           uVar42 >> 3) + uVar39;
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + 0x6ca6351 +
          uVar39;
  uVar7 = iVar1 + uVar7;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar9 & (uVar4 | uVar2));
  uVar42 = ((uVar36 >> 0x11 | uVar36 * 0x8000) ^ (uVar36 >> 0x13 | uVar36 * 0x2000) ^ uVar36 >> 10)
           + uVar26 +
           ((uVar10 >> 7 | uVar10 * 0x2000000) ^ (uVar10 >> 0x12 | uVar10 * 0x4000) ^ uVar10 >> 3) +
           uVar42;
  iVar1 = uVar8 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + 0x14292967 +
          uVar42;
  uVar9 = iVar1 + uVar9;
  uVar8 = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4));
  uVar10 = ((uVar39 >> 0x11 | uVar39 * 0x8000) ^ (uVar39 >> 0x13 | uVar39 * 0x2000) ^ uVar39 >> 10)
           + uVar28 +
           ((uVar12 >> 7 | uVar12 * 0x2000000) ^ (uVar12 >> 0x12 | uVar12 * 0x4000) ^ uVar12 >> 3) +
           uVar10;
  iVar1 = uVar3 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                  (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + 0x27b70a85 +
          uVar10;
  uVar2 = iVar1 + uVar2;
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                  (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
  uVar12 = ((uVar42 >> 0x11 | uVar42 * 0x8000) ^ (uVar42 >> 0x13 | uVar42 * 0x2000) ^ uVar42 >> 10)
           + uVar30 +
           ((uVar14 >> 7 | uVar14 * 0x2000000) ^ (uVar14 >> 0x12 | uVar14 * 0x4000) ^ uVar14 >> 3) +
           uVar12;
  iVar1 = uVar5 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + 0x2e1b2138 +
          uVar12;
  uVar4 = iVar1 + uVar4;
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar14 = ((uVar10 >> 0x11 | uVar10 * 0x8000) ^ (uVar10 >> 0x13 | uVar10 * 0x2000) ^ uVar10 >> 10)
           + uVar32 +
           ((uVar16 >> 7 | uVar16 * 0x2000000) ^ (uVar16 >> 0x12 | uVar16 * 0x4000) ^ uVar16 >> 3) +
           uVar14;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + 0x4d2c6dfc +
          uVar14;
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                  (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar16 = ((uVar12 >> 0x11 | uVar12 * 0x8000) ^ (uVar12 >> 0x13 | uVar12 * 0x2000) ^ uVar12 >> 10)
           + uVar34 +
           ((uVar18 >> 7 | uVar18 * 0x2000000) ^ (uVar18 >> 0x12 | uVar18 * 0x4000) ^ uVar18 >> 3) +
           uVar16;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + 0x53380d13 +
          uVar16;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5));
  uVar18 = ((uVar14 >> 0x11 | uVar14 * 0x8000) ^ (uVar14 >> 0x13 | uVar14 * 0x2000) ^ uVar14 >> 10)
           + uVar36 +
           ((uVar20 >> 7 | uVar20 * 0x2000000) ^ (uVar20 >> 0x12 | uVar20 * 0x4000) ^ uVar20 >> 3) +
           uVar18;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + 0x650a7354 +
          uVar18;
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 | uVar5 & (uVar9 | uVar7));
  uVar20 = ((uVar16 >> 0x11 | uVar16 * 0x8000) ^ (uVar16 >> 0x13 | uVar16 * 0x2000) ^ uVar16 >> 10)
           + uVar39 +
           ((uVar22 >> 7 | uVar22 * 0x2000000) ^ (uVar22 >> 0x12 | uVar22 * 0x4000) ^ uVar22 >> 3) +
           uVar20;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + 0x766a0abb +
          uVar20;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                  (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 | uVar7 & (uVar2 | uVar9));
  uVar22 = ((uVar18 >> 0x11 | uVar18 * 0x8000) ^ (uVar18 >> 0x13 | uVar18 * 0x2000) ^ uVar18 >> 10)
           + uVar42 +
           ((uVar24 >> 7 | uVar24 * 0x2000000) ^ (uVar24 >> 0x12 | uVar24 * 0x4000) ^ uVar24 >> 3) +
           uVar22;
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + -0x7e3d36d2
          + uVar22;
  uVar7 = iVar1 + uVar7;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar9 & (uVar4 | uVar2));
  uVar24 = ((uVar20 >> 0x11 | uVar20 * 0x8000) ^ (uVar20 >> 0x13 | uVar20 * 0x2000) ^ uVar20 >> 10)
           + uVar10 +
           ((uVar26 >> 7 | uVar26 * 0x2000000) ^ (uVar26 >> 0x12 | uVar26 * 0x4000) ^ uVar26 >> 3) +
           uVar24;
  iVar1 = uVar8 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + -0x6d8dd37b
          + uVar24;
  uVar9 = iVar1 + uVar9;
  uVar8 = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4));
  uVar26 = ((uVar22 >> 0x11 | uVar22 * 0x8000) ^ (uVar22 >> 0x13 | uVar22 * 0x2000) ^ uVar22 >> 10)
           + uVar12 +
           ((uVar28 >> 7 | uVar28 * 0x2000000) ^ (uVar28 >> 0x12 | uVar28 * 0x4000) ^ uVar28 >> 3) +
           uVar26;
  iVar1 = uVar3 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                  (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + -0x5d40175f
          + uVar26;
  uVar2 = iVar1 + uVar2;
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                  (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
  uVar28 = ((uVar24 >> 0x11 | uVar24 * 0x8000) ^ (uVar24 >> 0x13 | uVar24 * 0x2000) ^ uVar24 >> 10)
           + uVar14 +
           ((uVar30 >> 7 | uVar30 * 0x2000000) ^ (uVar30 >> 0x12 | uVar30 * 0x4000) ^ uVar30 >> 3) +
           uVar28;
  iVar1 = uVar5 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + -0x57e599b5
          + uVar28;
  uVar4 = iVar1 + uVar4;
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar30 = ((uVar26 >> 0x11 | uVar26 * 0x8000) ^ (uVar26 >> 0x13 | uVar26 * 0x2000) ^ uVar26 >> 10)
           + uVar16 +
           ((uVar32 >> 7 | uVar32 * 0x2000000) ^ (uVar32 >> 0x12 | uVar32 * 0x4000) ^ uVar32 >> 3) +
           uVar30;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + -0x3db47490
          + uVar30;
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                  (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar32 = ((uVar28 >> 0x11 | uVar28 * 0x8000) ^ (uVar28 >> 0x13 | uVar28 * 0x2000) ^ uVar28 >> 10)
           + uVar18 +
           ((uVar34 >> 7 | uVar34 * 0x2000000) ^ (uVar34 >> 0x12 | uVar34 * 0x4000) ^ uVar34 >> 3) +
           uVar32;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + -0x3893ae5d
          + uVar32;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5));
  uVar34 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
           + uVar20 +
           ((uVar36 >> 7 | uVar36 * 0x2000000) ^ (uVar36 >> 0x12 | uVar36 * 0x4000) ^ uVar36 >> 3) +
           uVar34;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + -0x2e6d17e7
          + uVar34;
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 | uVar5 & (uVar9 | uVar7));
  uVar36 = ((uVar32 >> 0x11 | uVar32 * 0x8000) ^ (uVar32 >> 0x13 | uVar32 * 0x2000) ^ uVar32 >> 10)
           + uVar22 +
           ((uVar39 >> 7 | uVar39 * 0x2000000) ^ (uVar39 >> 0x12 | uVar39 * 0x4000) ^ uVar39 >> 3) +
           uVar36;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + -0x2966f9dc
          + uVar36;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                  (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 | uVar7 & (uVar2 | uVar9));
  uVar39 = ((uVar34 >> 0x11 | uVar34 * 0x8000) ^ (uVar34 >> 0x13 | uVar34 * 0x2000) ^ uVar34 >> 10)
           + uVar24 +
           ((uVar42 >> 7 | uVar42 * 0x2000000) ^ (uVar42 >> 0x12 | uVar42 * 0x4000) ^ uVar42 >> 3) +
           uVar39;
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + -0xbf1ca7b +
          uVar39;
  uVar7 = iVar1 + uVar7;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar9 & (uVar4 | uVar2));
  uVar42 = ((uVar36 >> 0x11 | uVar36 * 0x8000) ^ (uVar36 >> 0x13 | uVar36 * 0x2000) ^ uVar36 >> 10)
           + uVar26 +
           ((uVar10 >> 7 | uVar10 * 0x2000000) ^ (uVar10 >> 0x12 | uVar10 * 0x4000) ^ uVar10 >> 3) +
           uVar42;
  iVar1 = uVar8 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + 0x106aa070 +
          uVar42;
  uVar9 = iVar1 + uVar9;
  uVar8 = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4));
  uVar10 = ((uVar39 >> 0x11 | uVar39 * 0x8000) ^ (uVar39 >> 0x13 | uVar39 * 0x2000) ^ uVar39 >> 10)
           + uVar28 +
           ((uVar12 >> 7 | uVar12 * 0x2000000) ^ (uVar12 >> 0x12 | uVar12 * 0x4000) ^ uVar12 >> 3) +
           uVar10;
  iVar1 = uVar3 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                  (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + 0x19a4c116 +
          uVar10;
  uVar2 = iVar1 + uVar2;
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                  (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
  uVar12 = ((uVar42 >> 0x11 | uVar42 * 0x8000) ^ (uVar42 >> 0x13 | uVar42 * 0x2000) ^ uVar42 >> 10)
           + uVar30 +
           ((uVar14 >> 7 | uVar14 * 0x2000000) ^ (uVar14 >> 0x12 | uVar14 * 0x4000) ^ uVar14 >> 3) +
           uVar12;
  iVar1 = uVar5 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + 0x1e376c08 +
          uVar12;
  uVar4 = iVar1 + uVar4;
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar14 = ((uVar10 >> 0x11 | uVar10 * 0x8000) ^ (uVar10 >> 0x13 | uVar10 * 0x2000) ^ uVar10 >> 10)
           + uVar32 +
           ((uVar16 >> 7 | uVar16 * 0x2000000) ^ (uVar16 >> 0x12 | uVar16 * 0x4000) ^ uVar16 >> 3) +
           uVar14;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + 0x2748774c +
          uVar14;
  uVar6 = iVar1 + uVar6;
  uVar7 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                  (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar16 = ((uVar12 >> 0x11 | uVar12 * 0x8000) ^ (uVar12 >> 0x13 | uVar12 * 0x2000) ^ uVar12 >> 10)
           + uVar34 +
           ((uVar18 >> 7 | uVar18 * 0x2000000) ^ (uVar18 >> 0x12 | uVar18 * 0x4000) ^ uVar18 >> 3) +
           uVar16;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + 0x34b0bcb5 +
          uVar16;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar5 | uVar3 & (uVar7 | uVar5));
  uVar18 = ((uVar14 >> 0x11 | uVar14 * 0x8000) ^ (uVar14 >> 0x13 | uVar14 * 0x2000) ^ uVar14 >> 10)
           + uVar36 +
           ((uVar20 >> 7 | uVar20 * 0x2000000) ^ (uVar20 >> 0x12 | uVar20 * 0x4000) ^ uVar20 >> 3) +
           uVar18;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + 0x391c0cb3 +
          uVar18;
  uVar3 = iVar1 + uVar3;
  uVar2 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar7 | uVar5 & (uVar9 | uVar7));
  uVar20 = ((uVar16 >> 0x11 | uVar16 * 0x8000) ^ (uVar16 >> 0x13 | uVar16 * 0x2000) ^ uVar16 >> 10)
           + uVar39 +
           ((uVar22 >> 7 | uVar22 * 0x2000000) ^ (uVar22 >> 0x12 | uVar22 * 0x4000) ^ uVar22 >> 3) +
           uVar20;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + 0x4ed8aa4a +
          uVar20;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                  (uVar2 >> 0x16 | uVar2 * 0x400)) + (uVar2 & uVar9 | uVar7 & (uVar2 | uVar9));
  uVar22 = ((uVar18 >> 0x11 | uVar18 * 0x8000) ^ (uVar18 >> 0x13 | uVar18 * 0x2000) ^ uVar18 >> 10)
           + uVar42 +
           ((uVar24 >> 7 | uVar24 * 0x2000000) ^ (uVar24 >> 0x12 | uVar24 * 0x4000) ^ uVar24 >> 3) +
           uVar22;
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + 0x5b9cca4f +
          uVar22;
  uVar7 = iVar1 + uVar7;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar2 | uVar9 & (uVar4 | uVar2));
  uVar24 = ((uVar20 >> 0x11 | uVar20 * 0x8000) ^ (uVar20 >> 0x13 | uVar20 * 0x2000) ^ uVar20 >> 10)
           + uVar10 +
           ((uVar26 >> 7 | uVar26 * 0x2000000) ^ (uVar26 >> 0x12 | uVar26 * 0x4000) ^ uVar26 >> 3) +
           uVar24;
  iVar1 = uVar8 + ((uVar7 >> 6 | uVar7 * 0x4000000) ^ (uVar7 >> 0xb | uVar7 * 0x200000) ^
                  (uVar7 >> 0x19 | uVar7 * 0x80)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) + 0x682e6ff3 +
          uVar24;
  uVar9 = iVar1 + uVar9;
  uVar8 = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                  (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar2 & (uVar6 | uVar4));
  uVar26 = ((uVar22 >> 0x11 | uVar22 * 0x8000) ^ (uVar22 >> 0x13 | uVar22 * 0x2000) ^ uVar22 >> 10)
           + uVar12 +
           ((uVar28 >> 7 | uVar28 * 0x2000000) ^ (uVar28 >> 0x12 | uVar28 * 0x4000) ^ uVar28 >> 3) +
           uVar26;
  iVar1 = uVar3 + ((uVar9 >> 6 | uVar9 * 0x4000000) ^ (uVar9 >> 0xb | uVar9 * 0x200000) ^
                  (uVar9 >> 0x19 | uVar9 * 0x80)) + (uVar5 ^ uVar9 & (uVar7 ^ uVar5)) + 0x748f82ee +
          uVar26;
  uVar2 = iVar1 + uVar2;
  uVar3 = iVar1 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                  (uVar8 >> 0x16 | uVar8 * 0x400)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
  uVar28 = ((uVar24 >> 0x11 | uVar24 * 0x8000) ^ (uVar24 >> 0x13 | uVar24 * 0x2000) ^ uVar24 >> 10)
           + uVar14 +
           ((uVar30 >> 7 | uVar30 * 0x2000000) ^ (uVar30 >> 0x12 | uVar30 * 0x4000) ^ uVar30 >> 3) +
           uVar28;
  iVar1 = uVar5 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                  (uVar2 >> 0x19 | uVar2 * 0x80)) + (uVar7 ^ uVar2 & (uVar9 ^ uVar7)) + 0x78a5636f +
          uVar28;
  uVar4 = iVar1 + uVar4;
  uVar5 = iVar1 + ((uVar3 >> 2 | uVar3 * 0x40000000) ^ (uVar3 >> 0xd | uVar3 * 0x80000) ^
                  (uVar3 >> 0x16 | uVar3 * 0x400)) + (uVar3 & uVar8 | uVar6 & (uVar3 | uVar8));
  uVar30 = ((uVar26 >> 0x11 | uVar26 * 0x8000) ^ (uVar26 >> 0x13 | uVar26 * 0x2000) ^ uVar26 >> 10)
           + uVar16 +
           ((uVar32 >> 7 | uVar32 * 0x2000000) ^ (uVar32 >> 0x12 | uVar32 * 0x4000) ^ uVar32 >> 3) +
           uVar30;
  iVar1 = uVar7 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                  (uVar4 >> 0x19 | uVar4 * 0x80)) + (uVar9 ^ uVar4 & (uVar2 ^ uVar9)) + -0x7b3787ec
          + uVar30;
  uVar6 = iVar1 + uVar6;
  uVar11 = iVar1 + ((uVar5 >> 2 | uVar5 * 0x40000000) ^ (uVar5 >> 0xd | uVar5 * 0x80000) ^
                   (uVar5 >> 0x16 | uVar5 * 0x400)) + (uVar5 & uVar3 | uVar8 & (uVar5 | uVar3));
  uVar32 = ((uVar28 >> 0x11 | uVar28 * 0x8000) ^ (uVar28 >> 0x13 | uVar28 * 0x2000) ^ uVar28 >> 10)
           + uVar18 +
           ((uVar34 >> 7 | uVar34 * 0x2000000) ^ (uVar34 >> 0x12 | uVar34 * 0x4000) ^ uVar34 >> 3) +
           uVar32;
  iVar1 = uVar9 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                  (uVar6 >> 0x19 | uVar6 * 0x80)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) + -0x7338fdf8
          + uVar32;
  uVar8 = iVar1 + uVar8;
  uVar9 = iVar1 + ((uVar11 >> 2 | uVar11 * 0x40000000) ^ (uVar11 >> 0xd | uVar11 * 0x80000) ^
                  (uVar11 >> 0x16 | uVar11 * 0x400)) + (uVar11 & uVar5 | uVar3 & (uVar11 | uVar5));
  uVar34 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
           + uVar20 +
           ((uVar36 >> 7 | uVar36 * 0x2000000) ^ (uVar36 >> 0x12 | uVar36 * 0x4000) ^ uVar36 >> 3) +
           uVar34;
  iVar1 = uVar2 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                  (uVar8 >> 0x19 | uVar8 * 0x80)) + (uVar4 ^ uVar8 & (uVar6 ^ uVar4)) + -0x6f410006
          + uVar34;
  uVar3 = iVar1 + uVar3;
  uVar7 = iVar1 + ((uVar9 >> 2 | uVar9 * 0x40000000) ^ (uVar9 >> 0xd | uVar9 * 0x80000) ^
                  (uVar9 >> 0x16 | uVar9 * 0x400)) + (uVar9 & uVar11 | uVar5 & (uVar9 | uVar11));
  uVar36 = ((uVar32 >> 0x11 | uVar32 * 0x8000) ^ (uVar32 >> 0x13 | uVar32 * 0x2000) ^ uVar32 >> 10)
           + uVar22 +
           ((uVar39 >> 7 | uVar39 * 0x2000000) ^ (uVar39 >> 0x12 | uVar39 * 0x4000) ^ uVar39 >> 3) +
           uVar36;
  iVar1 = uVar4 + ((uVar3 >> 6 | uVar3 * 0x4000000) ^ (uVar3 >> 0xb | uVar3 * 0x200000) ^
                  (uVar3 >> 0x19 | uVar3 * 0x80)) + (uVar6 ^ uVar3 & (uVar8 ^ uVar6)) + -0x5baf9315
          + uVar36;
  uVar5 = iVar1 + uVar5;
  uVar4 = iVar1 + ((uVar7 >> 2 | uVar7 * 0x40000000) ^ (uVar7 >> 0xd | uVar7 * 0x80000) ^
                  (uVar7 >> 0x16 | uVar7 * 0x400)) + (uVar7 & uVar9 | uVar11 & (uVar7 | uVar9));
  iVar1 = uVar6 + ((uVar5 >> 6 | uVar5 * 0x4000000) ^ (uVar5 >> 0xb | uVar5 * 0x200000) ^
                  (uVar5 >> 0x19 | uVar5 * 0x80)) + (uVar8 ^ uVar5 & (uVar3 ^ uVar8)) + -0x41065c09
          + uVar39 + ((uVar34 >> 0x11 | uVar34 * 0x8000) ^ (uVar34 >> 0x13 | uVar34 * 0x2000) ^
                     uVar34 >> 10) + uVar24 +
            ((uVar42 >> 7 | uVar42 * 0x2000000) ^ (uVar42 >> 0x12 | uVar42 * 0x4000) ^ uVar42 >> 3);
  uVar11 = iVar1 + uVar11;
  uVar6 = iVar1 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                  (uVar4 >> 0x16 | uVar4 * 0x400)) + (uVar4 & uVar7 | uVar9 & (uVar4 | uVar7));
  iVar1 = uVar8 + ((uVar11 >> 6 | uVar11 * 0x4000000) ^ (uVar11 >> 0xb | uVar11 * 0x200000) ^
                  (uVar11 >> 0x19 | uVar11 * 0x80)) + (uVar3 ^ uVar11 & (uVar5 ^ uVar3)) +
          -0x398e870e +
          uVar42 + ((uVar36 >> 0x11 | uVar36 * 0x8000) ^ (uVar36 >> 0x13 | uVar36 * 0x2000) ^
                   uVar36 >> 10) + uVar26 +
          ((uVar10 >> 7 | uVar10 * 0x2000000) ^ (uVar10 >> 0x12 | uVar10 * 0x4000) ^ uVar10 >> 3);
  *s = iVar1 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
               (uVar6 >> 0x16 | uVar6 * 0x400)) + (uVar6 & uVar4 | uVar7 & (uVar6 | uVar4)) + *s;
  s[1] = uVar6 + s[1];
  s[2] = uVar4 + s[2];
  s[3] = uVar7 + s[3];
  s[4] = iVar1 + uVar9 + s[4];
  s[5] = uVar11 + s[5];
  s[6] = uVar5 + s[6];
  s[7] = uVar3 + s[7];
  return;
}

Assistant:

static void secp256k1_sha256_transform(uint32_t* s, const uint32_t* chunk) {
    uint32_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
    uint32_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98, w0 = BE32(chunk[0]));
    Round(h, a, b, c, d, e, f, g, 0x71374491, w1 = BE32(chunk[1]));
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcf, w2 = BE32(chunk[2]));
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba5, w3 = BE32(chunk[3]));
    Round(e, f, g, h, a, b, c, d, 0x3956c25b, w4 = BE32(chunk[4]));
    Round(d, e, f, g, h, a, b, c, 0x59f111f1, w5 = BE32(chunk[5]));
    Round(c, d, e, f, g, h, a, b, 0x923f82a4, w6 = BE32(chunk[6]));
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5, w7 = BE32(chunk[7]));
    Round(a, b, c, d, e, f, g, h, 0xd807aa98, w8 = BE32(chunk[8]));
    Round(h, a, b, c, d, e, f, g, 0x12835b01, w9 = BE32(chunk[9]));
    Round(g, h, a, b, c, d, e, f, 0x243185be, w10 = BE32(chunk[10]));
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3, w11 = BE32(chunk[11]));
    Round(e, f, g, h, a, b, c, d, 0x72be5d74, w12 = BE32(chunk[12]));
    Round(d, e, f, g, h, a, b, c, 0x80deb1fe, w13 = BE32(chunk[13]));
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a7, w14 = BE32(chunk[14]));
    Round(b, c, d, e, f, g, h, a, 0xc19bf174, w15 = BE32(chunk[15]));

    Round(a, b, c, d, e, f, g, h, 0xe49b69c1, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc6, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x240ca1cc, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6f, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aa, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dc, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x76f988da, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x983e5152, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa831c66d, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xb00327c8, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf3, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x14292967, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x27b70a85, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x2e1b2138, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x53380d13, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x650a7354, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x766a0abb, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92e, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x92722c85, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a1, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa81a664b, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a3, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xd192e819, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd6990624, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xf40e3585, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x106aa070, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x19a4c116, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x1e376c08, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x2748774c, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4a, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4f, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x748f82ee, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x78a5636f, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x84c87814, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x8cc70208, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x90befffa, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xa4506ceb, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7, w14 + sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2, w15 + sigma1(w13) + w8 + sigma0(w0));

    s[0] += a;
    s[1] += b;
    s[2] += c;
    s[3] += d;
    s[4] += e;
    s[5] += f;
    s[6] += g;
    s[7] += h;
}